

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int balance(BtCursor *pCur)

{
  void *__dest;
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  u8 uVar5;
  ushort uVar6;
  ushort uVar7;
  BtCursor *pBVar8;
  BtShared *pBVar9;
  u8 *puVar10;
  PgHdr *pPVar11;
  ulong uVar12;
  u8 uVar13;
  undefined1 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  char cVar17;
  u16 uVar18;
  u16 uVar19;
  ushort uVar20;
  int iVar21;
  uint uVar22;
  Pgno PVar23;
  int iVar24;
  int iVar25;
  u32 uVar26;
  Pgno PVar27;
  BtCursor **ppBVar28;
  void *pvVar29;
  MemPage **ppMVar30;
  ulong uVar31;
  MemPage *pMVar32;
  uint uVar33;
  long lVar34;
  undefined1 *puVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  uint uVar40;
  MemPage **ppMVar41;
  MemPage **ppMVar42;
  uint uVar43;
  MemPage *pPage;
  undefined4 *puVar44;
  MemPage *pMVar45;
  uint uVar46;
  int iVar47;
  Pgno PVar48;
  uint uVar49;
  uint uVar50;
  ulong uVar51;
  ulong uVar52;
  MemPage *pMVar53;
  uint uVar54;
  u8 *puVar55;
  long lVar56;
  ulong uVar57;
  u8 *puVar58;
  ushort *puVar59;
  int iVar60;
  int iVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  MemPage *pMVar65;
  MemPage *pMVar66;
  long in_FS_OFFSET;
  bool bVar67;
  uint *local_298;
  ulong local_290;
  int local_288;
  MemPage *pRef;
  MemPage *local_258;
  uint local_240;
  u16 *szCell_1;
  int local_220;
  char local_218;
  void *local_1f0;
  undefined1 local_1c8 [32];
  Pgno local_1a8;
  int local_1a4;
  char local_1a0 [8];
  u8 local_198 [16];
  MemPage *pChild;
  MemPage *pMStack_180;
  MemPage **local_178;
  MemPage **ppMStack_170;
  u8 *local_168 [5];
  u8 *puStack_140;
  int iStack_13c;
  undefined8 local_138;
  undefined1 *puStack_130;
  undefined8 local_128;
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined4 local_108;
  uint local_fc;
  undefined8 local_f8;
  undefined1 *puStack_f0;
  undefined4 local_e8;
  int iStack_dc;
  u16 szCell;
  undefined6 uStack_d6;
  undefined1 *puStack_d0;
  undefined4 local_c8;
  int iStack_bc;
  undefined8 local_b8;
  undefined1 *puStack_b0;
  undefined4 local_a8;
  long lStack_a0;
  undefined1 *local_98 [2];
  MemPage *local_88 [4];
  undefined1 *local_68;
  MemPage *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_198[8] = 0xaa;
  local_198[9] = 0xaa;
  local_198[10] = 0xaa;
  local_198[0xb] = 0xaa;
  local_198[0xc] = 0xaa;
  local_198[0] = 0xaa;
  local_198[1] = 0xaa;
  local_198[2] = 0xaa;
  local_198[3] = 0xaa;
  local_198[4] = 0xaa;
  local_198[5] = 0xaa;
  local_198[6] = 0xaa;
  local_198[7] = 0xaa;
  local_1f0 = (void *)0x0;
  pPage = pCur->pPage;
LAB_0014e1b0:
  if ((pPage->nFree < 0) && (iVar21 = btreeComputeFreeSpace(pPage), iVar21 != 0)) {
    iVar21 = 0;
  }
  else if (pPage->nOverflow == '\0') {
    iVar21 = 0;
    if (((int)(pCur->pBt->usableSize * 2) < pPage->nFree * 3) &&
       (cVar17 = pCur->iPage, iVar21 = 0, cVar17 != '\0')) {
LAB_0014e231:
      if ((int)pPage->pDbPage->nRef < 2) {
        pMVar45 = pCur->apPage[(long)cVar17 + -1];
        uVar20 = pCur->aiIdx[(long)cVar17 + -1];
        iVar21 = sqlite3PagerWrite(pMVar45->pDbPage);
        pvVar29 = local_1f0;
        if ((iVar21 == 0) &&
           ((-1 < pMVar45->nFree || (iVar21 = btreeComputeFreeSpace(pMVar45), iVar21 == 0)))) {
          if ((pPage->intKeyLeaf != '\0') &&
             ((((pPage->nOverflow == '\x01' && (pPage->aiOvfl[0] == pPage->nCell)) &&
               (pMVar45->pgno != 1)) && (pMVar45->nCell == uVar20)))) {
            if (pPage->aiOvfl[0] == 0) {
              iVar21 = sqlite3CorruptError(0x13379);
            }
            else {
              pBVar9 = pPage->pBt;
              local_88[0] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
              local_b8 = (undefined1 *)CONCAT44(local_b8._4_4_,0xaaaaaaaa);
              iVar21 = allocateBtreePage(pBVar9,local_88,(Pgno *)&local_b8,0,'\0');
              if (iVar21 == 0) {
                local_58[0] = (MemPage *)pPage->apOvfl[0];
                uVar18 = (*pPage->xCellSize)(pPage,(u8 *)local_58[0]);
                pMVar65 = local_88[0];
                _szCell = (MemPage *)CONCAT62(uStack_d6,uVar18);
                local_128 = &DAT_aaaaaaaaaaaaaaaa;
                local_138 = &DAT_aaaaaaaaaaaaaaaa;
                puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
                local_168[4] = &DAT_aaaaaaaaaaaaaaaa;
                puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
                local_168[2] = &DAT_aaaaaaaaaaaaaaaa;
                local_168[3] = &DAT_aaaaaaaaaaaaaaaa;
                local_168[0] = &DAT_aaaaaaaaaaaaaaaa;
                local_168[1] = &DAT_aaaaaaaaaaaaaaaa;
                local_178 = (MemPage **)&DAT_aaaaaaaaaaaaaaaa;
                ppMStack_170 = (MemPage **)&DAT_aaaaaaaaaaaaaaaa;
                pChild = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
                pMStack_180 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
                zeroPage(local_88[0],0xd);
                pChild = (MemPage *)CONCAT44(pChild._4_4_,1);
                local_178 = local_58;
                ppMStack_170 = (MemPage **)&szCell;
                local_168[0] = pPage->aDataEnd;
                local_138._0_4_ = 2;
                local_128._4_4_ = 0x7fffffff;
                pMStack_180 = pPage;
                iVar21 = rebuildPage((CellArray *)&pChild,0,1,pMVar65);
                local_1c8._0_4_ = iVar21;
                if (iVar21 == 0) {
                  pMVar65->nFree =
                       (pBVar9->usableSize - ((uint)szCell + (uint)pMVar65->cellOffset)) + -2;
                  if (pBVar9->autoVacuum != '\0') {
                    ptrmapPut(pBVar9,(Pgno)local_b8,'\x05',pMVar45->pgno,(int *)local_1c8);
                    if (pMVar65->minLocal < szCell) {
                      ptrmapPutOvflPtr(pMVar65,pMVar65,&local_58[0]->isInit,(int *)local_1c8);
                    }
                  }
                  uVar62 = (ulong)(CONCAT11(pPage->aCellIdx[(ulong)pPage->nCell * 2 + -2],
                                            pPage->aCellIdx[(ulong)pPage->nCell * 2 + -1]) &
                                  pPage->maskPage);
                  uVar51 = 0;
                  puVar10 = pPage->aData + uVar62;
                  pMVar66 = (MemPage *)(pPage->aData + uVar62 + 2);
                  do {
                    pMVar32 = pMVar66;
                    puVar55 = puVar10;
                    if (7 < uVar51) break;
                    uVar51 = uVar51 + 1;
                    puVar10 = puVar55 + 1;
                    pMVar66 = (MemPage *)&pMVar32->intKey;
                  } while ((char)*puVar55 < '\0');
                  lVar36 = 4;
                  do {
                    uVar5 = *(u8 *)((long)&pMVar32[-1].xParseCell + 7);
                    local_58[0] = pMVar32;
                    local_198[lVar36] = uVar5;
                    lVar36 = lVar36 + 1;
                    if (-1 < (char)uVar5) break;
                    bVar67 = pMVar32 < (MemPage *)(puVar55 + 10);
                    pMVar32 = (MemPage *)&pMVar32->intKey;
                  } while (bVar67);
                  iVar21 = local_1c8._0_4_;
                  if (local_1c8._0_4_ == 0) {
                    iVar21 = insertCell(pMVar45,(uint)pMVar45->nCell,local_198,(int)lVar36,(u8 *)0x0
                                        ,pPage->pgno);
                  }
                  *(Pgno *)(pMVar45->aData + (ulong)pMVar45->hdrOffset + 8) =
                       (Pgno)local_b8 >> 0x18 | ((Pgno)local_b8 & 0xff0000) >> 8 |
                       ((Pgno)local_b8 & 0xff00) << 8 | (Pgno)local_b8 << 0x18;
                }
                releasePage(pMVar65);
              }
            }
            goto LAB_0014e9c8;
          }
          pvVar29 = pcache1Alloc(pCur->pBt->pageSize);
          local_1a4 = 0;
          local_58[2] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_58[0] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_58[1] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_88[2] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_88[3] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_88[0] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_88[1] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_98[0] = &DAT_aaaaaaaaaaaaaaaa;
          local_98[1] = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = 0xaaaaaaaa;
          local_b8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_c8 = 0xaaaaaaaa;
          _szCell = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
          local_e8 = 0xaaaaaaaa;
          local_f8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
          local_1a0[0] = '\0';
          local_1a0[1] = '\0';
          local_1a0[2] = '\0';
          local_1a0[3] = '\0';
          local_108 = 0xaaaaaaaa;
          local_118 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
          local_1a0[4] = 0;
          pChild = (MemPage *)0x0;
          pMStack_180 = (MemPage *)0x0;
          local_178 = (MemPage **)0x0;
          ppMStack_170 = (MemPage **)0x0;
          local_168[0] = (u8 *)0x0;
          local_168[1] = (u8 *)0x0;
          local_168[2] = (u8 *)0x0;
          local_168[3] = (u8 *)0x0;
          local_168[4] = (u8 *)0x0;
          puStack_140 = (u8 *)0x0;
          local_138._0_4_ = 0;
          local_138._4_4_ = 0;
          puStack_130 = (undefined1 *)0x0;
          local_128._0_4_ = 0;
          local_128._4_4_ = 0x7fffffff;
          iVar21 = 7;
          if (pvVar29 != (void *)0x0) {
            uVar49 = pCur->hints & 1;
            uVar54 = (uint)pMVar45->nCell + (uint)pMVar45->nOverflow;
            iVar21 = 0;
            uVar33 = (uint)uVar20;
            if (1 < uVar54) {
              if (uVar33 == 0) {
                iVar21 = 0;
              }
              else if (uVar54 == uVar33) {
                iVar21 = uVar33 + uVar49 + -2;
              }
              else {
                iVar21 = uVar33 - 1;
              }
              uVar54 = 2 - uVar49;
            }
            uVar62 = (ulong)uVar54;
            uVar39 = (iVar21 - (uint)pMVar45->nOverflow) + uVar54;
            puVar10 = pMVar45->aData;
            if (uVar39 == pMVar45->nCell) {
              uVar51 = (ulong)pMVar45->hdrOffset + 8;
            }
            else {
              uVar51 = (ulong)(CONCAT11(pMVar45->aCellIdx[(long)(int)uVar39 * 2],
                                        pMVar45->aCellIdx[(long)(int)uVar39 * 2 + 1]) &
                              pMVar45->maskPage);
            }
            pBVar9 = pMVar45->pBt;
            uVar22 = uVar54 + 1;
            PVar23 = sqlite3Get4byte(puVar10 + uVar51);
            uVar64 = (ulong)(uVar54 * 8);
            uVar39 = iVar21 + -1 + uVar54;
            local_298 = &local_fc + uVar62;
            iVar60 = 0;
            iVar61 = 0;
            local_290 = uVar62;
            while (uVar12 = (ulong)uVar22, iVar60 == 0) {
              local_1a4 = getAndInitPage(pBVar9,PVar23,(MemPage **)((long)local_58 + uVar64),0);
              if (local_1a4 != 0) break;
              pMVar65 = *(MemPage **)((long)local_58 + uVar64);
              if ((pMVar65->nFree < 0) &&
                 (local_1a4 = btreeComputeFreeSpace(pMVar65), local_1a4 != 0)) goto LAB_0014e92e;
              iVar60 = iVar61 + (uint)pMVar65->nCell;
              iVar61 = iVar60 + 4;
              if (uVar64 == 0) {
                uVar46 = iVar60 + 7;
                uVar39 = uVar46 & 0x7ffffffc;
                local_1a8 = PVar23;
                ppMVar30 = (MemPage **)sqlite3Malloc((long)(int)(uVar39 * 10 + pBVar9->pageSize));
                local_178 = ppMVar30;
                if (ppMVar30 == (MemPage **)0x0) {
                  local_1a4 = 7;
                  goto LAB_0014efe7;
                }
                ppMVar42 = ppMVar30 + uVar39;
                ppMStack_170 = ppMVar42;
                pMStack_180 = local_58[0];
                bVar2 = local_58[0]->leaf;
                lVar36 = (ulong)bVar2 * 4;
                bVar3 = local_58[0]->intKeyLeaf;
                uVar64 = 0;
                iVar61 = 0;
                iVar60 = 0;
                goto LAB_0014eab9;
              }
              local_290 = local_290 - 1;
              uVar46 = uVar39;
              if (pMVar45->nOverflow == 0) {
LAB_0014e83c:
                lVar36 = (long)(int)(uVar46 - pMVar45->nOverflow);
                puVar55 = pMVar45->aData +
                          (CONCAT11(pMVar45->aCellIdx[lVar36 * 2],pMVar45->aCellIdx[lVar36 * 2 + 1])
                          & pMVar45->maskPage);
                *(u8 **)((long)&lStack_a0 + uVar64) = puVar55;
                PVar23 = sqlite3Get4byte(puVar55);
                uVar18 = (*pMVar45->xCellSize)(pMVar45,puVar55);
                *local_298 = (uint)uVar18;
                if (((pBVar9->btsFlags & 0xc) != 0) &&
                   (iVar60 = (int)puVar55 - *(int *)&pMVar45->aData,
                   (int)(iVar60 + (uint)uVar18) <= (int)pBVar9->usableSize)) {
                  memcpy((void *)((long)iVar60 + (long)pvVar29),puVar55,(ulong)(uint)uVar18);
                  *(long *)((long)&lStack_a0 + uVar64) =
                       ((long)puVar55 - (long)pMVar45->aData) + (long)pvVar29;
                }
                dropCell(pMVar45,uVar46 - pMVar45->nOverflow,(uint)uVar18,&local_1a4);
                iVar60 = local_1a4;
              }
              else {
                if (uVar39 != pMVar45->aiOvfl[0]) {
                  uVar46 = iVar21 + (int)local_290;
                  goto LAB_0014e83c;
                }
                puVar55 = pMVar45->apOvfl[0];
                *(u8 **)((long)&lStack_a0 + uVar64) = puVar55;
                PVar23 = sqlite3Get4byte(puVar55);
                uVar18 = (*pMVar45->xCellSize)(pMVar45,puVar55);
                *local_298 = (uint)uVar18;
                pMVar45->nOverflow = '\0';
                iVar60 = 0;
              }
              uVar64 = uVar64 - 8;
              uVar39 = uVar39 - 1;
              local_298 = local_298 + -1;
            }
            uVar64 = uVar64 + 8;
LAB_0014e92e:
            __memset_chk(local_58,0,uVar64,0x18);
            uVar46 = 0;
            iVar25 = local_1a4;
            goto LAB_0014e94a;
          }
          goto LAB_0014e9a6;
        }
        goto LAB_0014e9c8;
      }
      iVar21 = 0x137f9;
LAB_0014feda:
      iVar21 = sqlite3CorruptError(iVar21);
    }
  }
  else {
    cVar17 = pCur->iPage;
    if (cVar17 != '\0') goto LAB_0014e231;
    ppBVar28 = &pCur->pBt->pCursor;
    while (pBVar8 = *ppBVar28, pBVar8 != (BtCursor *)0x0) {
      if (((pBVar8 != pCur) && (pBVar8->eState == '\0')) && (pBVar8->pPage == pCur->pPage)) {
        iVar21 = 0x137bd;
        goto LAB_0014feda;
      }
      ppBVar28 = &pBVar8->pNext;
    }
    pChild = (MemPage *)0x0;
    local_58[0] = (MemPage *)((ulong)local_58[0] & 0xffffffff00000000);
    pBVar9 = pPage->pBt;
    iVar21 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar21 == 0) {
      iVar21 = allocateBtreePage(pBVar9,&pChild,(Pgno *)local_58,pPage->pgno,'\0');
      pMVar45 = pChild;
      local_88[0] = (MemPage *)CONCAT44(local_88[0]._4_4_,iVar21);
      copyNodeContent(pPage,pChild,(int *)local_88);
      if (pBVar9->autoVacuum != '\0') {
        ptrmapPut(pBVar9,(Pgno)local_58[0],'\x05',pPage->pgno,(int *)local_88);
      }
      iVar21 = (int)local_88[0];
      if ((int)local_88[0] != 0) goto LAB_0014ff22;
      memcpy(pMVar45->aiOvfl,pPage->aiOvfl,(ulong)((uint)pPage->nOverflow * 2));
      memcpy(pMVar45->apOvfl,pPage->apOvfl,(ulong)pPage->nOverflow << 3);
      pMVar45->nOverflow = pPage->nOverflow;
      zeroPage(pPage,*pMVar45->aData & 0xfffffff7);
      *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
           (Pgno)local_58[0] >> 0x18 | ((Pgno)local_58[0] & 0xff0000) >> 8 |
           ((Pgno)local_58[0] & 0xff00) << 8 | (Pgno)local_58[0] << 0x18;
      pCur->apPage[1] = pMVar45;
      pCur->iPage = '\x01';
      pCur->ix = 0;
      pCur->aiIdx[0] = 0;
      pCur->apPage[0] = pPage;
      iVar21 = 0;
      goto LAB_0014e9ea;
    }
    pMVar45 = (MemPage *)0x0;
LAB_0014ff22:
    pCur->apPage[1] = (MemPage *)0x0;
    releasePage(pMVar45);
  }
  goto LAB_0014fee1;
LAB_0014eab9:
  local_288._0_2_ = (ushort)lVar36;
  local_220 = (int)lVar36;
  if (uVar64 == uVar12) goto LAB_0014ed3a;
  pMVar65 = local_58[uVar64];
  puVar55 = pMVar65->aData;
  if (*puVar55 != *local_58[0]->aData) {
    local_1a4 = sqlite3CorruptError(0x13521);
LAB_0014efe7:
    uVar46 = 0;
    iVar25 = local_1a4;
    goto LAB_0014e94a;
  }
  uVar20 = pMVar65->nCell;
  uVar6 = pMVar65->maskPage;
  puVar58 = puVar55 + pMVar65->cellOffset;
  uVar63 = (ulong)iVar61;
  memset((void *)((long)ppMVar42 + uVar63 * 2),0,
         (ulong)(((uint)uVar20 + (uint)pMVar65->nOverflow) * 2));
  bVar4 = pMVar65->nOverflow;
  if ((ulong)bVar4 != 0) {
    uVar50 = (uint)pMVar65->aiOvfl[0];
    if (pMVar65->aiOvfl[0] <= uVar20) {
      lVar34 = uVar63 << 0x20;
      ppMVar41 = ppMVar30 + uVar63;
      while (bVar67 = uVar50 != 0, uVar50 = uVar50 - 1, bVar67) {
        ppMVar30[uVar63] = (MemPage *)(puVar55 + (CONCAT11(*puVar58,puVar58[1]) & uVar6));
        puVar58 = puVar58 + 2;
        uVar63 = uVar63 + 1;
        lVar34 = lVar34 + 0x100000000;
        iVar61 = iVar61 + 1;
        ppMVar41 = ppMVar41 + 1;
      }
      for (uVar63 = 0; bVar4 != uVar63; uVar63 = uVar63 + 1) {
        *ppMVar41 = (MemPage *)pMVar65->apOvfl[uVar63];
        lVar34 = lVar34 + 0x100000000;
        iVar61 = iVar61 + 1;
        ppMVar41 = ppMVar41 + 1;
      }
      pChild = (MemPage *)CONCAT44(pChild._4_4_,iVar61);
      uVar63 = lVar34 >> 0x20;
      goto LAB_0014ebca;
    }
    iVar25 = sqlite3CorruptError(0x13539);
    uVar46 = 0;
    goto LAB_0014e94a;
  }
LAB_0014ebca:
  uVar20 = pMVar65->cellOffset;
  uVar7 = pMVar65->nCell;
  lVar34 = uVar63 << 0x20;
  for (; puVar58 < puVar55 + (ulong)uVar7 * 2 + (ulong)uVar20; puVar58 = puVar58 + 2) {
    ppMVar30[uVar63] = (MemPage *)(puVar55 + (uVar6 & CONCAT11(*puVar58,puVar58[1])));
    uVar63 = uVar63 + 1;
    pChild = (MemPage *)CONCAT44(pChild._4_4_,(int)uVar63);
    lVar34 = lVar34 + 0x100000000;
  }
  *(int *)(&szCell + uVar64 * 2) = (int)uVar63;
  if ((uVar64 < uVar62) && (bVar3 == 0)) {
    uVar50 = *(uint *)((long)&local_f8 + uVar64 * 4);
    uVar40 = uVar50 & 0xffff;
    lVar56 = lVar34 >> 0x1f;
    *(short *)((long)ppMVar42 + lVar56) = (short)uVar50;
    __dest = (void *)((long)ppMVar42 + (long)iVar60 + (ulong)uVar39 * 2);
    iVar60 = iVar60 + uVar40;
    memcpy(__dest,local_98[uVar64],(ulong)uVar40);
    puVar44 = (undefined4 *)((long)__dest + lVar36);
    *(undefined4 **)((long)ppMVar30 + (lVar34 >> 0x1d)) = puVar44;
    local_220 = (uint)*(ushort *)((long)ppMVar42 + lVar56) - local_220;
    *(short *)((long)ppMVar42 + lVar56) = (short)local_220;
    if (pMVar65->leaf == '\0') {
      *puVar44 = *(undefined4 *)(pMVar65->aData + 8);
    }
    else {
      puVar35 = (undefined1 *)
                ((long)ppMVar30 + (long)iVar60 + (ulong)(uVar46 >> 2 & 0x1fffffff) * 0x28);
      while ((ushort)local_220 < 4) {
        *puVar35 = 0;
        local_220 = *(ushort *)((long)ppMVar42 + (lVar34 >> 0x20) * 2) + 1;
        *(short *)((long)ppMVar42 + (lVar34 >> 0x20) * 2) = (short)local_220;
        iVar60 = iVar60 + 1;
        puVar35 = puVar35 + 1;
      }
    }
    uVar50 = (int)uVar63 + 1;
    uVar63 = (ulong)uVar50;
    pChild = (MemPage *)CONCAT44(pChild._4_4_,uVar50);
  }
  uVar64 = uVar64 + 1;
  iVar61 = (int)uVar63;
  goto LAB_0014eab9;
LAB_0014ed3a:
  iVar60 = pBVar9->usableSize + (uint)(ushort)local_288 + -0xc;
  iVar61 = 0;
  for (uVar64 = 0; uVar64 != uVar12; uVar64 = uVar64 + 1) {
    pMVar65 = local_58[uVar64];
    lVar36 = (long)iVar61;
    local_168[lVar36] = pMVar65->aDataEnd;
    iVar25 = *(int *)(&szCell + uVar64 * 2);
    *(int *)((long)&local_138 + lVar36 * 4) = iVar25;
    if (iVar61 == 0) {
      iVar47 = 0;
    }
    else {
      iVar47 = iVar61 + -1;
      if (iVar25 != (&iStack_13c)[lVar36]) {
        iVar47 = iVar61;
      }
    }
    if (bVar3 == 0) {
      lVar36 = (long)iVar47;
      iVar47 = iVar47 + 1;
      local_168[lVar36 + 1] = pMVar45->aDataEnd;
      *(int *)((long)&local_138 + lVar36 * 4 + 4) = iVar25 + 1;
    }
    iVar61 = iVar60 - pMVar65->nFree;
    *(int *)((long)&local_f8 + uVar64 * 4) = iVar61;
    for (uVar63 = 0; uVar63 < pMVar65->nOverflow; uVar63 = uVar63 + 1) {
      uVar18 = (*pMVar65->xCellSize)(pMVar65,pMVar65->apOvfl[uVar63]);
      iVar61 = iVar61 + (uint)uVar18 + 2;
      *(int *)((long)&local_f8 + uVar64 * 4) = iVar61;
    }
    *(int *)((long)&local_b8 + uVar64 * 4) = iVar25;
    iVar61 = iVar47 + 1;
  }
  iVar61 = (int)pChild;
  local_298 = (uint *)((ulong)pChild & 0xffffffff);
  uVar64 = (ulong)uVar22;
  uVar63 = 0;
LAB_0014ee3d:
  do {
    ppMVar30 = ppMStack_170;
    iVar25 = (int)uVar64;
    uVar39 = (uint)bVar3;
    if ((long)iVar25 <= (long)uVar63) {
      szCell_1 = (u16 *)ppMStack_170;
      uVar63 = (ulong)(iVar25 - 1);
      break;
    }
    uVar52 = uVar63 + 1;
    for (iVar25 = *(int *)((long)&local_f8 + uVar63 * 4); iVar60 < iVar25;
        iVar25 = iVar25 - (uVar18 + 2)) {
      local_288 = (int)uVar52;
      if ((int)uVar64 <= local_288) {
        if (3 < uVar63) {
          *(int *)((long)&local_f8 + uVar63 * 4) = iVar25;
          iVar25 = sqlite3CorruptError(0x1359e);
          uVar46 = 0;
          goto LAB_0014e94a;
        }
        *(undefined4 *)((long)&local_f8 + uVar63 * 4 + 4) = 0;
        *(int *)((long)&local_b8 + uVar63 * 4 + 4) = iVar61;
        uVar64 = (ulong)((int)uVar63 + 2);
      }
      iVar47 = *(int *)((long)&local_b8 + uVar63 * 4);
      uVar18 = cachedCellSize((CellArray *)&pChild,iVar47 + -1);
      iVar24 = uVar18 + 2;
      if ((bVar3 == 0) && (iVar24 = 0, iVar47 < iVar61)) {
        uVar19 = cachedCellSize((CellArray *)&pChild,iVar47);
        iVar24 = uVar19 + 2;
      }
      piVar1 = (int *)((long)&local_f8 + uVar63 * 4 + 4);
      *piVar1 = *piVar1 + iVar24;
      *(int *)((long)&local_b8 + uVar63 * 4) = iVar47 + -1;
    }
    *(int *)((long)&local_f8 + uVar63 * 4) = iVar25;
    iVar47 = *(int *)((long)&local_b8 + uVar63 * 4);
    while (iVar47 < iVar61) {
      uVar20 = cachedCellSize((CellArray *)&pChild,iVar47);
      iVar25 = iVar25 + (uint)uVar20 + 2;
      if (iVar60 < iVar25) {
        *(int *)((long)&local_b8 + uVar63 * 4) = iVar47;
        if (uVar63 == 0) {
          iVar25 = 0;
        }
        else {
          iVar25 = (&iStack_bc)[uVar63];
        }
        uVar63 = uVar52;
        if (iVar25 < iVar47) goto LAB_0014ee3d;
        iVar21 = 0x135bf;
        goto LAB_0014f191;
      }
      iVar47 = iVar47 + 1;
      *(int *)((long)&local_f8 + uVar63 * 4) = iVar25;
      if (uVar39 == 0) {
        iVar24 = 0;
        if (iVar47 < iVar61) {
          uVar20 = cachedCellSize((CellArray *)&pChild,iVar47);
          goto LAB_0014ef66;
        }
      }
      else {
LAB_0014ef66:
        iVar24 = uVar20 + 2;
      }
      piVar1 = (int *)((long)&local_f8 + uVar63 * 4 + 4);
      *piVar1 = *piVar1 - iVar24;
    }
    *(int *)((long)&local_b8 + uVar63 * 4) = iVar47;
    uVar64 = uVar52;
    uVar63 = uVar52;
  } while( true );
  do {
    local_218 = (char)uVar49;
    if ((int)uVar63 < 1) {
      bVar4 = *local_58[0]->aData;
      uVar63 = 0;
      uVar64 = uVar64 & 0xffffffff;
      if (iVar25 < 1) {
        uVar64 = uVar63;
      }
      uVar49 = 0;
      goto LAB_0014f327;
    }
    uVar46 = (&local_fc)[uVar63];
    iVar47 = *(int *)((long)&local_f8 + uVar63 * 4);
    uVar52 = uVar63 - 1;
    uVar57 = (ulong)(&iStack_bc)[uVar63];
    cachedCellSize((CellArray *)&pChild,(&iStack_bc)[uVar63] - uVar39);
    puVar59 = (ushort *)((long)ppMVar30 + (uVar57 * 2 - (ulong)(uVar39 * 2)));
    do {
      uVar50 = (uint)uVar57;
      uVar40 = uVar50 - 1;
      uVar18 = cachedCellSize((CellArray *)&pChild,uVar40);
      if (iVar47 == 0) {
        iVar24 = *puVar59 + 2;
      }
      else {
        uVar43 = uVar50;
        if ((local_218 != '\0') ||
           (iVar24 = (uint)*puVar59 + iVar47 + 2,
           (int)(((uint)(uVar63 == iVar25 - 1) * 2 + -2 + uVar46) - (uint)uVar18) < iVar24)) break;
      }
      iVar47 = iVar24;
      uVar46 = (uVar46 - uVar18) - 2;
      *(uint *)((long)&local_b8 + uVar52 * 4) = uVar40;
      puVar59 = puVar59 + -1;
      uVar57 = (ulong)uVar40;
      uVar43 = uVar40;
    } while (1 < (int)uVar50);
    *(int *)((long)&local_f8 + uVar63 * 4) = iVar47;
    *(uint *)((long)&local_f8 + uVar52 * 4) = uVar46;
    iVar47 = 0;
    if (uVar63 != 1) {
      iVar47 = *(int *)((long)&local_b8 + (ulong)((int)uVar63 - 2) * 4);
    }
    uVar63 = uVar52;
  } while (iVar47 < (int)uVar43);
  iVar21 = 0x135eb;
LAB_0014f191:
  iVar25 = sqlite3CorruptError(iVar21);
  uVar46 = 0;
  goto LAB_0014e94a;
LAB_0014f327:
  uVar46 = uVar49;
  if (uVar64 == uVar63) goto LAB_0014f450;
  local_1c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if (uVar62 < uVar63) {
    PVar23 = 1;
    if (local_218 == '\0') {
      PVar23 = local_1a8;
    }
    local_1a4 = allocateBtreePage(pBVar9,(MemPage **)local_1c8,&local_1a8,PVar23,'\0');
    uVar15 = local_1c8._0_8_;
    iVar25 = local_1a4;
    if (local_1a4 != 0) goto LAB_0014e94a;
    local_240 = (uint)bVar4;
    zeroPage((MemPage *)local_1c8._0_8_,local_240);
    local_88[uVar63] = (MemPage *)uVar15;
    *(int *)(&szCell + uVar63 * 2) = iVar61;
    if (pBVar9->autoVacuum != '\0') {
      ptrmapPut(pBVar9,*(Pgno *)(uVar15 + 4),'\x05',pMVar45->pgno,&local_1a4);
      goto LAB_0014f433;
    }
  }
  else {
    pMVar65 = local_58[uVar63];
    local_88[uVar63] = pMVar65;
    local_58[uVar63] = (MemPage *)0x0;
    local_1a4 = sqlite3PagerWrite(pMVar65->pDbPage);
    if (((uVar33 - iVar21 == uVar63) + 1 != (int)pMVar65->pDbPage->nRef) && (local_1a4 == 0)) {
      iVar21 = 0x1360c;
      uVar49 = uVar49 + 1;
      goto LAB_0014fd8d;
    }
LAB_0014f433:
    uVar46 = uVar49 + 1;
    iVar25 = local_1a4;
    if (local_1a4 != 0) goto LAB_0014e94a;
  }
  uVar49 = uVar49 + 1;
  uVar63 = uVar63 + 1;
  goto LAB_0014f327;
LAB_0014f450:
  uVar64 = 0;
  if (0 < (int)uVar49) {
    uVar64 = (ulong)uVar49;
  }
  for (uVar63 = 0; uVar64 != uVar63; uVar63 = uVar63 + 1) {
    *(Pgno *)((long)&local_118 + uVar63 * 4) = local_88[uVar63]->pgno;
  }
  uVar33 = uVar49 - 1;
  uVar63 = 0;
  if (0 < (int)uVar33) {
    uVar63 = (ulong)uVar33;
  }
  uVar52 = 1;
  for (uVar57 = 0; uVar57 != uVar63; uVar57 = uVar57 + 1) {
    uVar37 = uVar57 & 0xffffffff;
    for (uVar31 = uVar52; (int)uVar31 < (int)uVar49; uVar31 = uVar31 + 1) {
      uVar16 = uVar31 & 0xffffffff;
      if (local_88[(int)uVar37]->pgno <= local_88[uVar31]->pgno) {
        uVar16 = uVar37;
      }
      uVar37 = uVar16;
    }
    if (uVar57 != uVar37) {
      pMVar65 = local_88[uVar57];
      PVar23 = pMVar65->pgno;
      pMVar66 = local_88[(int)uVar37];
      PVar27 = pMVar66->pgno;
      uVar50 = (uint)sqlite3PendingByte / pBVar9->pageSize;
      pPVar11 = pMVar65->pDbPage;
      uVar18 = pPVar11->flags;
      uVar19 = pMVar66->pDbPage->flags;
      pPVar11->flags = uVar19;
      sqlite3PcacheMove(pPVar11,uVar50 + 1);
      pPVar11 = pMVar66->pDbPage;
      pPVar11->flags = uVar18;
      sqlite3PcacheMove(pPVar11,PVar23);
      pPVar11 = pMVar65->pDbPage;
      pPVar11->flags = uVar19;
      sqlite3PcacheMove(pPVar11,PVar27);
      pMVar65->pgno = PVar27;
      pMVar66->pgno = PVar23;
    }
    uVar52 = uVar52 + 1;
  }
  pMVar65 = local_88[(int)uVar33];
  uVar33 = pMVar65->pgno;
  *(uint *)(puVar10 + uVar51) =
       uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8 | uVar33 << 0x18;
  if (((bVar4 & 8) == 0) && (uVar22 != uVar49)) {
    ppMVar30 = local_58;
    if ((int)uVar22 < (int)uVar49) {
      ppMVar30 = local_88;
    }
    *(undefined4 *)(pMVar65->aData + 8) = *(undefined4 *)(ppMVar30[uVar62]->aData + 8);
  }
  lVar36 = (long)(int)uVar49;
  if (pBVar9->autoVacuum != '\0') {
    uVar52 = (ulong)((uint)local_88[0]->nOverflow + (uint)local_88[0]->nCell);
    local_258 = local_88[0];
    iVar61 = 0;
    lVar34 = 0;
    pMVar65 = local_88[0];
    for (uVar51 = 0; (long)uVar51 < (long)(int)local_298; uVar51 = uVar51 + 1) {
      pMVar66 = local_178[uVar51];
      lVar56 = (long)(int)lVar34;
      lVar34 = lVar34 << 0x20;
      ppMVar30 = local_58 + lVar56 + 1;
      ppMVar42 = local_88 + lVar56 + 1;
      for (; uVar51 == uVar52;
          uVar52 = (ulong)((int)uVar52 + (uint)(uVar39 == 0) + (uint)pMVar65->nCell +
                          (uint)pMVar65->nOverflow)) {
        lVar56 = lVar56 + 1;
        ppMVar41 = ppMVar30;
        if (lVar56 < lVar36) {
          ppMVar41 = ppMVar42;
        }
        pMVar65 = *ppMVar41;
        lVar34 = lVar34 + 0x100000000;
        ppMVar30 = ppMVar30 + 1;
        ppMVar42 = ppMVar42 + 1;
      }
      lVar38 = (long)iVar61;
      if (uVar51 == *(uint *)((long)&local_b8 + lVar38 * 4)) {
        iVar61 = iVar61 + 1;
        local_258 = local_88[lVar38 + 1];
        if (uVar39 != 0) goto LAB_0014f6cf;
      }
      else {
LAB_0014f6cf:
        if (((((int)uVar49 <= (int)lVar56) ||
             (local_258->pgno != *(Pgno *)((long)&local_118 + (lVar34 >> 0x1e)))) ||
            (pMVar66 < (MemPage *)pMVar65->aData)) || ((MemPage *)pMVar65->aDataEnd <= pMVar66)) {
          if (bVar2 == 0) {
            uVar26 = sqlite3Get4byte(&pMVar66->isInit);
            ptrmapPut(pBVar9,uVar26,'\x05',local_258->pgno,&local_1a4);
          }
          uVar18 = cachedCellSize((CellArray *)&pChild,(int)uVar51);
          if (local_258->minLocal < uVar18) {
            ptrmapPutOvflPtr(local_258,pMVar65,&pMVar66->isInit,&local_1a4);
          }
          iVar25 = local_1a4;
          if (local_1a4 != 0) goto LAB_0014e94a;
          local_298 = (uint *)((ulong)pChild & 0xffffffff);
        }
      }
      lVar34 = lVar56;
    }
    szCell_1 = (u16 *)ppMStack_170;
    iVar61 = (int)local_298;
  }
  local_298._0_4_ = iVar61;
  ppMVar30 = local_178;
  uVar51 = 0;
  iVar61 = 0;
  do {
    pMVar65 = pMStack_180;
    if (uVar51 == uVar63) {
      uVar33 = -uVar49;
      PVar23 = (Pgno)local_b8;
      goto LAB_0014f981;
    }
    pMVar65 = local_88[uVar51];
    iVar25 = *(int *)((long)&local_b8 + uVar51 * 4);
    pMVar66 = ppMVar30[iVar25];
    uVar33 = local_220 + (uint)szCell_1[iVar25];
    pMVar53 = (MemPage *)((long)iVar61 + (long)pvVar29);
    pMVar32 = pMVar53;
    if (pMVar65->leaf == '\0') {
      puVar10 = pMVar65->aData;
      uVar5 = pMVar66->intKey;
      uVar13 = pMVar66->intKeyLeaf;
      uVar14 = pMVar66->field_0x3;
      puVar10[8] = pMVar66->isInit;
      puVar10[9] = uVar5;
      puVar10[10] = uVar13;
      puVar10[0xb] = uVar14;
    }
    else if (bVar3 == 0) {
      pMVar66 = (MemPage *)((long)&pMVar66[-1].xParseCell + 4);
      if (szCell_1[iVar25] == 4) {
        uVar18 = (*pMVar45->xCellSize)(pMVar45,(u8 *)pMVar66);
        uVar33 = (uint)uVar18;
      }
    }
    else {
      local_1c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_1c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_1c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      lVar34 = (long)iVar25;
      iVar25 = iVar25 + -1;
      (*pMVar65->xParseCell)(pMVar65,&ppMVar30[lVar34 + -1]->isInit,(CellInfo *)local_1c8);
      iVar47 = sqlite3PutVarint((uchar *)&pMVar53->pgno,local_1c8._0_8_);
      uVar33 = iVar47 + 4;
      pMVar32 = (MemPage *)0x0;
      pMVar66 = pMVar53;
    }
    lVar34 = 0;
    do {
      lVar56 = lVar34 + 4;
      piVar1 = (int *)((long)&local_138 + lVar34);
      lVar34 = lVar56;
    } while (*piVar1 <= iVar25);
    pMVar53 = *(MemPage **)((long)&ppMStack_170 + lVar56 * 2);
    if ((pMVar66 < pMVar53) &&
       (pMVar53 < (MemPage *)((long)pMVar66->aiOvfl + (long)(int)uVar33 + -0x1c))) {
      iVar21 = 0x136d5;
      goto LAB_0014fd8d;
    }
    iVar61 = iVar61 + uVar33;
    iVar25 = insertCell(pMVar45,iVar21 + (int)uVar51,&pMVar66->isInit,uVar33,&pMVar32->isInit,
                        pMVar65->pgno);
    uVar51 = uVar51 + 1;
  } while (iVar25 == 0);
LAB_0014e94a:
  local_1a4 = iVar25;
  sqlite3DbFree((sqlite3 *)0x0,local_178);
  for (uVar62 = 0; uVar12 != uVar62; uVar62 = uVar62 + 1) {
    releasePage(local_58[uVar62]);
  }
  if ((int)uVar46 < 1) {
    uVar46 = 0;
  }
  for (uVar62 = 0; iVar21 = local_1a4, uVar46 != uVar62; uVar62 = uVar62 + 1) {
    releasePage(local_88[uVar62]);
  }
LAB_0014e9a6:
  if (local_1f0 != (void *)0x0) {
    pcache1Free(local_1f0);
  }
LAB_0014e9c8:
  local_1f0 = pvVar29;
  pPage->nOverflow = '\0';
  releasePage(pPage);
  cVar17 = pCur->iPage + -1;
  pCur->iPage = cVar17;
  pMVar45 = pCur->apPage[cVar17];
LAB_0014e9ea:
  pCur->pPage = pMVar45;
  pPage = pMVar45;
  if (iVar21 != 0) {
LAB_0014fee1:
    if (local_1f0 != (void *)0x0) {
      pcache1Free(local_1f0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return iVar21;
  }
  goto LAB_0014e1b0;
  while( true ) {
    uVar39 = -uVar33;
    if (0 < (int)uVar33) {
      uVar39 = uVar33;
    }
    uVar51 = (ulong)uVar39;
    if (local_1a0[uVar51] == '\0') break;
LAB_0014f981:
    pMVar66 = local_88[0];
    uVar33 = uVar33 + 1;
    if ((int)uVar49 <= (int)uVar33) goto LAB_0014fd9e;
  }
  if ((int)uVar33 < 0) {
    if ((&iStack_dc)[(int)uVar39] < (&iStack_bc)[(int)uVar39]) goto LAB_0014f981;
LAB_0014f9d0:
    if (uVar54 < uVar39) {
      uVar63 = (ulong)(uVar39 - 1);
      iVar21 = (int)local_298;
    }
    else {
      uVar63 = (ulong)(int)(uVar39 - 1);
      iVar21 = *(int *)(&szCell + uVar63 * 2) + (uint)(bVar3 == 0);
    }
    iVar61 = *(int *)((long)&local_b8 + uVar63 * 4) + (uint)(bVar3 == 0);
    PVar27 = *(int *)((long)&local_b8 + uVar51 * 4) - iVar61;
  }
  else {
    if (uVar33 != 0) goto LAB_0014f9d0;
    iVar61 = 0;
    iVar21 = 0;
    PVar27 = PVar23;
  }
  pMVar66 = local_88[uVar51];
  puVar10 = pMVar66->aData;
  uVar63 = (ulong)pMVar66->hdrOffset;
  pMVar32 = (MemPage *)(pMVar66->aCellIdx + (int)(PVar27 * 2));
  uVar20 = pMVar66->nCell;
  bVar4 = pMVar66->nOverflow;
  uVar22 = (uint)uVar20;
  uVar39 = uVar22;
  if (iVar21 < iVar61) {
    iVar25 = pageFreeArray(pMVar66,iVar21,iVar61 - iVar21,(CellArray *)&pChild);
    uVar39 = uVar22 - iVar25;
    if ((int)uVar22 < iVar25) {
      iVar21 = 0x13307;
LAB_0014fd8d:
      iVar25 = sqlite3CorruptError(iVar21);
      uVar46 = uVar49;
      goto LAB_0014e94a;
    }
    memmove(pMVar66->aCellIdx,pMVar66->aCellIdx + iVar25 * 2,(ulong)((uint)uVar20 * 2));
  }
  iVar25 = (uint)uVar20 + iVar21 + (uint)bVar4;
  iVar24 = PVar27 + iVar61;
  iVar47 = iVar25 - iVar24;
  if (iVar47 != 0 && iVar24 <= iVar25) {
    iVar25 = pageFreeArray(pMVar66,iVar24,iVar47,(CellArray *)&pChild);
    uVar39 = uVar39 - iVar25;
  }
  local_1c8._0_8_ =
       puVar10 + (ushort)(*(ushort *)(puVar10 + uVar63 + 5) << 8 |
                         *(ushort *)(puVar10 + uVar63 + 5) >> 8);
  if (((ulong)local_1c8._0_8_ < pMVar32) || ((MemPage *)pMVar66->aDataEnd < (ulong)local_1c8._0_8_))
  {
LAB_0014fc95:
    if ((int)PVar27 < 1) {
      iVar21 = 0x13351;
      goto LAB_0014fd8d;
    }
    lVar34 = (long)iVar61 * 2;
    for (PVar48 = PVar27; 0 < (int)PVar48; PVar48 = PVar48 - 1) {
      if (*(short *)((long)szCell_1 + lVar34) == 0) {
        uVar18 = (*pMVar65->xCellSize)(pMVar65,*(u8 **)((long)ppMVar30 + lVar34 * 4));
        *(u16 *)((long)szCell_1 + lVar34) = uVar18;
      }
      lVar34 = lVar34 + 2;
    }
    iVar25 = rebuildPage((CellArray *)&pChild,iVar61,PVar27,pMVar66);
    if (iVar25 != 0) goto LAB_0014e94a;
  }
  else {
    if (iVar61 < iVar21) {
      PVar48 = iVar21 - iVar61;
      if ((int)PVar27 <= iVar21 - iVar61) {
        PVar48 = PVar27;
      }
      puVar55 = pMVar66->aCellIdx;
      memmove(puVar55 + (int)(PVar48 * 2),puVar55,(long)(int)(uVar39 * 2));
      iVar25 = pageInsertArray(pMVar66,(u8 *)pMVar32,(u8 **)local_1c8,puVar55,iVar61,PVar48,
                               (CellArray *)&pChild);
      if (iVar25 != 0) goto LAB_0014fc95;
      uVar39 = uVar39 + PVar48;
    }
    for (uVar52 = 0; uVar52 < pMVar66->nOverflow; uVar52 = uVar52 + 1) {
      iVar47 = (uint)pMVar66->aiOvfl[uVar52] + iVar21;
      iVar25 = iVar47 - iVar61;
      if ((-1 < iVar25) && (iVar25 < (int)PVar27)) {
        puVar55 = pMVar66->aCellIdx + (uint)(iVar25 * 2);
        if (uVar39 - iVar25 != 0 && iVar25 <= (int)uVar39) {
          memmove(puVar55 + 2,puVar55,(long)(int)((uVar39 - iVar25) * 2));
        }
        cachedCellSize((CellArray *)&pChild,iVar47);
        iVar25 = pageInsertArray(pMVar66,(u8 *)pMVar32,(u8 **)local_1c8,puVar55,iVar47,1,
                                 (CellArray *)&pChild);
        if (iVar25 != 0) goto LAB_0014fc95;
        uVar39 = uVar39 + 1;
      }
    }
    iVar21 = pageInsertArray(pMVar66,(u8 *)pMVar32,(u8 **)local_1c8,
                             pMVar66->aCellIdx + (int)(uVar39 * 2),uVar39 + iVar61,PVar27 - uVar39,
                             (CellArray *)&pChild);
    if (iVar21 != 0) goto LAB_0014fc95;
    pMVar66->nCell = (u16)PVar27;
    pMVar66->nOverflow = '\0';
    puVar10[uVar63 + 3] = (u8)(PVar27 >> 8);
    puVar10[uVar63 + 4] = (u8)pMVar66->nCell;
    uVar20 = (short)local_1c8._0_8_ - (short)puVar10;
    *(ushort *)(puVar10 + uVar63 + 5) = uVar20 * 0x100 | uVar20 >> 8;
  }
  local_1a0[uVar51] = '\x01';
  pMVar66->nFree = iVar60 - *(int *)((long)&local_f8 + uVar51 * 4);
  goto LAB_0014f981;
LAB_0014fd9e:
  local_1a4 = 0;
  if (((cVar17 == '\x01') && (pMVar45->nCell == 0)) &&
     ((int)(uint)pMVar45->hdrOffset <= local_88[0]->nFree)) {
    local_1a4 = defragmentPage(local_88[0],-1);
    copyNodeContent(pMVar66,pMVar45,&local_1a4);
    freePage(pMVar66,&local_1a4);
  }
  else if (bVar2 == 0 && pBVar9->autoVacuum != '\0') {
    for (uVar51 = 0; uVar64 != uVar51; uVar51 = uVar51 + 1) {
      pMVar45 = local_88[uVar51];
      uVar26 = sqlite3Get4byte(pMVar45->aData + 8);
      ptrmapPut(pBVar9,uVar26,'\x05',pMVar45->pgno,&local_1a4);
    }
  }
  for (; iVar25 = local_1a4, lVar36 <= (long)uVar62; lVar36 = lVar36 + 1) {
    freePage(local_58[lVar36],&local_1a4);
  }
  goto LAB_0014e94a;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( pPage->nOverflow==0 && pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
      /* No rebalance required as long as:
      **   (1) There are no overflow cells
      **   (2) The amount of free space on the page is less than 2/3rds of
      **       the total usable space on the page. */
      break;
    }else if( (iPage = pCur->iPage)==0 ){
      if( pPage->nOverflow && (rc = anotherValidCursor(pCur))==SQLITE_OK ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( sqlite3PagerPageRefcount(pPage->pDbPage)>1 ){
      /* The page being written is not a root page, and there is currently
      ** more than one reference to it. This only happens if the page is one
      ** of its own ancestor pages. Corruption. */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer.
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 );
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          **
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below.
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot()
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}